

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_ustar.c
# Opt level: O0

int format_octal(int64_t v,char *p,int s)

{
  int in_EDX;
  undefined1 *__src;
  undefined1 *in_RSI;
  long in_RDI;
  char *h;
  int len;
  bool local_29;
  int local_20;
  int local_1c;
  undefined1 *local_18;
  long local_10;
  int local_4;
  
  local_20 = in_EDX;
  local_18 = in_RSI;
  if (in_RDI < 0) {
    while (0 < local_20) {
      *local_18 = 0x30;
      local_20 = local_20 + -1;
      local_18 = local_18 + 1;
    }
    local_4 = -1;
  }
  else {
    local_1c = in_EDX;
    local_18 = in_RSI + in_EDX;
    local_10 = in_RDI;
    do {
      __src = local_18 + -1;
      local_18[-1] = ((byte)local_10 & 7) + 0x30;
      local_10 = local_10 >> 3;
      local_1c = local_1c + -1;
      local_29 = 0 < local_1c && 0 < local_10;
      local_18 = __src;
    } while (local_29);
    if (local_10 == 0) {
      memmove(in_RSI,__src,(long)(in_EDX - local_1c));
      local_18 = in_RSI + ((long)in_EDX - (long)local_1c);
      while (0 < local_1c) {
        *local_18 = 0x20;
        local_1c = local_1c + -1;
        local_18 = local_18 + 1;
      }
      local_4 = 0;
    }
    else {
      while (0 < local_20) {
        *local_18 = 0x37;
        local_20 = local_20 + -1;
        local_18 = local_18 + 1;
      }
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

static int
format_octal(int64_t v, char *p, int s)
{
	int len;

	len = s;

	/* Octal values can't be negative, so use 0. */
	if (v < 0) {
		while (len-- > 0)
			*p++ = '0';
		return (-1);
	}

	p += s;		/* Start at the end and work backwards. */
	while (s-- > 0) {
		*--p = (char)('0' + (v & 7));
		v >>= 3;
	}

	if (v == 0)
		return (0);

	/* If it overflowed, fill field with max value. */
	while (len-- > 0)
		*p++ = '7';

	return (-1);
}